

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_chunk_dup(nni_chunk *dst,nni_chunk *src)

{
  uint8_t *puVar1;
  nni_chunk *src_local;
  nni_chunk *dst_local;
  
  puVar1 = (uint8_t *)nni_zalloc(src->ch_cap);
  dst->ch_buf = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    dst_local._4_4_ = 2;
  }
  else {
    dst->ch_cap = src->ch_cap;
    dst->ch_len = src->ch_len;
    dst->ch_ptr = dst->ch_buf + ((long)src->ch_ptr - (long)src->ch_buf);
    if (dst->ch_len != 0) {
      memcpy(dst->ch_ptr,src->ch_ptr,dst->ch_len);
    }
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

static int
nni_chunk_dup(nni_chunk *dst, const nni_chunk *src)
{
	if ((dst->ch_buf = nni_zalloc(src->ch_cap)) == NULL) {
		return (NNG_ENOMEM);
	}
	dst->ch_cap = src->ch_cap;
	dst->ch_len = src->ch_len;
	dst->ch_ptr = dst->ch_buf + (src->ch_ptr - src->ch_buf);
	if (dst->ch_len > 0) {
		memcpy(dst->ch_ptr, src->ch_ptr, dst->ch_len);
	}
	return (0);
}